

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

CURLcode Curl_ossl_certchain(Curl_easy *data,SSL *ssl)

{
  int iVar1;
  CURLcode CVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  BIO_METHOD *pBVar6;
  BIO *a;
  X509 *pXVar7;
  X509_NAME *pXVar8;
  size_t sVar9;
  undefined8 uVar10;
  ASN1_INTEGER *pAVar11;
  X509_PUBKEY *pub;
  X509_EXTENSION *ex;
  BIO *out;
  ASN1_OBJECT *a_00;
  ASN1_OCTET_STRING *v;
  ASN1_TIME *pAVar12;
  EVP_PKEY *pkey;
  char *type;
  ulong uVar13;
  stack_st_X509 *psVar14;
  BUF_MEM *a_01;
  long lVar15;
  char *ptr;
  BUF_MEM *biomem;
  ASN1_OBJECT *pubkeyoid;
  X509_ALGOR *sigalg;
  X509 *local_d8;
  ASN1_BIT_STRING *psig;
  int local_c4;
  stack_st_X509 *local_c0;
  ASN1_OBJECT *sigalgoid;
  
  local_c0 = SSL_get_peer_cert_chain((SSL *)ssl);
  CVar2 = CURLE_OUT_OF_MEMORY;
  if (local_c0 != (stack_st_X509 *)0x0) {
    iVar1 = OPENSSL_sk_num(local_c0);
    CVar2 = Curl_ssl_init_certinfo(data,iVar1);
    if (CVar2 == CURLE_OK) {
      pBVar6 = BIO_s_mem();
      a = BIO_new(pBVar6);
      CVar2 = CURLE_OUT_OF_MEMORY;
      if (a != (BIO *)0x0) {
        local_c4 = iVar1;
        if (iVar1 < 1) {
          local_c4 = 0;
        }
        psVar14 = local_c0;
        for (iVar1 = 0; iVar1 != local_c4; iVar1 = iVar1 + 1) {
          pXVar7 = (X509 *)OPENSSL_sk_value(psVar14,iVar1);
          psig = (ASN1_BIT_STRING *)0x0;
          pXVar8 = X509_get_subject_name(pXVar7);
          X509_NAME_print_ex(a,pXVar8,0,0x82031f);
          sVar9 = BIO_ctrl(a,3,0,&ptr);
          Curl_ssl_push_certinfo_len(data,iVar1,"Subject",ptr,sVar9);
          BIO_ctrl(a,1,0,(void *)0x0);
          pXVar8 = X509_get_issuer_name(pXVar7);
          X509_NAME_print_ex(a,pXVar8,0,0x82031f);
          sVar9 = BIO_ctrl(a,3,0,&ptr);
          Curl_ssl_push_certinfo_len(data,iVar1,"Issuer",ptr,sVar9);
          BIO_ctrl(a,1,0,(void *)0x0);
          uVar10 = X509_get_version(pXVar7);
          BIO_printf(a,"%lx",uVar10);
          sVar9 = BIO_ctrl(a,3,0,&ptr);
          Curl_ssl_push_certinfo_len(data,iVar1,"Version",ptr,sVar9);
          BIO_ctrl(a,1,0,(void *)0x0);
          local_d8 = pXVar7;
          pAVar11 = X509_get_serialNumber(pXVar7);
          if (pAVar11->type == 0x102) {
            BIO_puts(a,"-");
          }
          for (lVar15 = 0; lVar15 < pAVar11->length; lVar15 = lVar15 + 1) {
            BIO_printf(a,"%02x",(ulong)pAVar11->data[lVar15]);
          }
          sVar9 = BIO_ctrl(a,3,0,&ptr);
          Curl_ssl_push_certinfo_len(data,iVar1,"Serial Number",ptr,sVar9);
          BIO_ctrl(a,1,0,(void *)0x0);
          sigalg = (X509_ALGOR *)0x0;
          pubkeyoid = (ASN1_OBJECT *)0x0;
          X509_get0_signature(&psig,&sigalg,local_d8);
          if (sigalg != (X509_ALGOR *)0x0) {
            sigalgoid = (ASN1_OBJECT *)0x0;
            X509_ALGOR_get0((ASN1_OBJECT **)&sigalgoid,(int *)0x0,(void **)0x0,(X509_ALGOR *)sigalg)
            ;
            i2a_ASN1_OBJECT(a,(ASN1_OBJECT *)sigalgoid);
            sVar9 = BIO_ctrl(a,3,0,&ptr);
            Curl_ssl_push_certinfo_len(data,iVar1,"Signature Algorithm",ptr,sVar9);
            BIO_ctrl(a,1,0,(void *)0x0);
          }
          pub = (X509_PUBKEY *)X509_get_X509_PUBKEY(local_d8);
          if ((pub != (X509_PUBKEY *)0x0) &&
             (X509_PUBKEY_get0_param
                        ((ASN1_OBJECT **)&pubkeyoid,(uchar **)0x0,(int *)0x0,(X509_ALGOR **)0x0,pub)
             , pubkeyoid != (ASN1_OBJECT *)0x0)) {
            i2a_ASN1_OBJECT(a,(ASN1_OBJECT *)pubkeyoid);
            sVar9 = BIO_ctrl(a,3,0,&ptr);
            Curl_ssl_push_certinfo_len(data,iVar1,"Public Key Algorithm",ptr,sVar9);
            BIO_ctrl(a,1,0,(void *)0x0);
          }
          uVar10 = X509_get0_extensions(local_d8);
          iVar3 = OPENSSL_sk_num(uVar10);
          if (0 < iVar3) {
            for (iVar3 = 0; iVar4 = OPENSSL_sk_num(uVar10), iVar3 < iVar4; iVar3 = iVar3 + 1) {
              ex = (X509_EXTENSION *)OPENSSL_sk_value(uVar10,iVar3);
              pBVar6 = BIO_s_mem();
              out = BIO_new(pBVar6);
              if (out == (BIO *)0x0) break;
              a_00 = X509_EXTENSION_get_object(ex);
              i2t_ASN1_OBJECT((char *)&sigalgoid,0x80,a_00);
              iVar4 = X509V3_EXT_print(out,ex,0,0);
              if (iVar4 == 0) {
                v = X509_EXTENSION_get_data(ex);
                ASN1_STRING_print(out,v);
              }
              BIO_ctrl(out,0x73,0,&biomem);
              Curl_ssl_push_certinfo_len(data,iVar1,(char *)&sigalgoid,biomem->data,biomem->length);
              BIO_free(out);
            }
          }
          pXVar7 = local_d8;
          pAVar12 = (ASN1_TIME *)X509_get0_notBefore(local_d8);
          ASN1_TIME_print(a,pAVar12);
          sVar9 = BIO_ctrl(a,3,0,&ptr);
          Curl_ssl_push_certinfo_len(data,iVar1,"Start date",ptr,sVar9);
          BIO_ctrl(a,1,0,(void *)0x0);
          pAVar12 = (ASN1_TIME *)X509_get0_notAfter(pXVar7);
          ASN1_TIME_print(a,pAVar12);
          sVar9 = BIO_ctrl(a,3,0,&ptr);
          Curl_ssl_push_certinfo_len(data,iVar1,"Expire date",ptr,sVar9);
          BIO_ctrl(a,1,0,(void *)0x0);
          pkey = X509_get_pubkey(pXVar7);
          if (pkey == (EVP_PKEY *)0x0) {
            if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
              Curl_infof(data,"   Unable to load public key");
            }
          }
          else {
            iVar3 = EVP_PKEY_get_id(pkey);
            if (iVar3 == 0x74) {
              sigalgoid = (ASN1_OBJECT *)0x0;
              biomem = (BUF_MEM *)0x0;
              sigalg = (X509_ALGOR *)0x0;
              pubkeyoid = (ASN1_OBJECT *)0x0;
              EVP_PKEY_get_bn_param(pkey,"p",&sigalgoid);
              EVP_PKEY_get_bn_param(pkey,"q",&biomem);
              EVP_PKEY_get_bn_param(pkey,"g",&sigalg);
              EVP_PKEY_get_bn_param(pkey,"pub",&pubkeyoid);
              pubkey_show(data,(BIO *)a,iVar1,"dsa","p",(BIGNUM *)sigalgoid);
              pubkey_show(data,(BIO *)a,iVar1,"dsa","q",(BIGNUM *)biomem);
              pubkey_show(data,(BIO *)a,iVar1,"dsa","g",(BIGNUM *)sigalg);
              type = "dsa";
LAB_0057e129:
              pubkey_show(data,(BIO *)a,iVar1,type,"pub_key",(BIGNUM *)pubkeyoid);
              BN_clear_free((BIGNUM *)sigalgoid);
              BN_clear_free((BIGNUM *)biomem);
              BN_clear_free((BIGNUM *)sigalg);
              a_01 = (BUF_MEM *)pubkeyoid;
LAB_0057e1ff:
              BN_clear_free((BIGNUM *)a_01);
            }
            else {
              if (iVar3 == 0x1c) {
                sigalgoid = (ASN1_OBJECT *)0x0;
                biomem = (BUF_MEM *)0x0;
                sigalg = (X509_ALGOR *)0x0;
                pubkeyoid = (ASN1_OBJECT *)0x0;
                EVP_PKEY_get_bn_param(pkey,"p",&sigalgoid);
                EVP_PKEY_get_bn_param(pkey,"q",&biomem);
                EVP_PKEY_get_bn_param(pkey,"g",&sigalg);
                EVP_PKEY_get_bn_param(pkey,"pub",&pubkeyoid);
                pubkey_show(data,(BIO *)a,iVar1,"dh","p",(BIGNUM *)sigalgoid);
                pubkey_show(data,(BIO *)a,iVar1,"dh","q",(BIGNUM *)biomem);
                pubkey_show(data,(BIO *)a,iVar1,"dh","g",(BIGNUM *)sigalg);
                type = "dh";
                goto LAB_0057e129;
              }
              if (iVar3 == 6) {
                sigalgoid = (ASN1_OBJECT *)0x0;
                biomem = (BUF_MEM *)0x0;
                EVP_PKEY_get_bn_param(pkey,"n",&sigalgoid);
                EVP_PKEY_get_bn_param(pkey,"e",&biomem);
                if (sigalgoid == (ASN1_OBJECT *)0x0) {
                  uVar13 = 0;
                }
                else {
                  uVar5 = BN_num_bits((BIGNUM *)sigalgoid);
                  uVar13 = (ulong)uVar5;
                }
                BIO_printf(a,"%d",uVar13);
                sVar9 = BIO_ctrl(a,3,0,&ptr);
                Curl_ssl_push_certinfo_len(data,iVar1,"RSA Public Key",ptr,sVar9);
                BIO_ctrl(a,1,0,(void *)0x0);
                pubkey_show(data,(BIO *)a,iVar1,"rsa","n",(BIGNUM *)sigalgoid);
                pubkey_show(data,(BIO *)a,iVar1,"rsa","e",(BIGNUM *)biomem);
                BN_clear_free((BIGNUM *)sigalgoid);
                a_01 = biomem;
                goto LAB_0057e1ff;
              }
            }
            EVP_PKEY_free(pkey);
          }
          psVar14 = local_c0;
          if (psig != (ASN1_BIT_STRING *)0x0) {
            for (lVar15 = 0; lVar15 < psig->length; lVar15 = lVar15 + 1) {
              BIO_printf(a,"%02x:",(ulong)psig->data[lVar15]);
            }
            sVar9 = BIO_ctrl(a,3,0,&ptr);
            Curl_ssl_push_certinfo_len(data,iVar1,"Signature",ptr,sVar9);
            BIO_ctrl(a,1,0,(void *)0x0);
          }
          PEM_write_bio_X509(a,local_d8);
          sVar9 = BIO_ctrl(a,3,0,&ptr);
          Curl_ssl_push_certinfo_len(data,iVar1,"Cert",ptr,sVar9);
          BIO_ctrl(a,1,0,(void *)0x0);
        }
        BIO_free(a);
        CVar2 = CURLE_OK;
      }
    }
  }
  return CVar2;
}

Assistant:

CURLcode Curl_ossl_certchain(struct Curl_easy *data, SSL *ssl)
{
  CURLcode result;
  STACK_OF(X509) *sk;
  int i;
  numcert_t numcerts;
  BIO *mem;

  DEBUGASSERT(ssl);

  sk = SSL_get_peer_cert_chain(ssl);
  if(!sk) {
    return CURLE_OUT_OF_MEMORY;
  }

  numcerts = sk_X509_num(sk);

  result = Curl_ssl_init_certinfo(data, (int)numcerts);
  if(result) {
    return result;
  }

  mem = BIO_new(BIO_s_mem());
  if(!mem) {
    return CURLE_OUT_OF_MEMORY;
  }

  for(i = 0; i < (int)numcerts; i++) {
    ASN1_INTEGER *num;
    X509 *x = sk_X509_value(sk, i);
    EVP_PKEY *pubkey = NULL;
    int j;
    char *ptr;
    const ASN1_BIT_STRING *psig = NULL;

    X509_NAME_print_ex(mem, X509_get_subject_name(x), 0, XN_FLAG_ONELINE);
    push_certinfo("Subject", i);

    X509_NAME_print_ex(mem, X509_get_issuer_name(x), 0, XN_FLAG_ONELINE);
    push_certinfo("Issuer", i);

    BIO_printf(mem, "%lx", X509_get_version(x));
    push_certinfo("Version", i);

    num = X509_get_serialNumber(x);
    if(num->type == V_ASN1_NEG_INTEGER)
      BIO_puts(mem, "-");
    for(j = 0; j < num->length; j++)
      BIO_printf(mem, "%02x", num->data[j]);
    push_certinfo("Serial Number", i);

#if defined(HAVE_X509_GET0_SIGNATURE) && defined(HAVE_X509_GET0_EXTENSIONS)
    {
      const X509_ALGOR *sigalg = NULL;
      X509_PUBKEY *xpubkey = NULL;
      ASN1_OBJECT *pubkeyoid = NULL;

      X509_get0_signature(&psig, &sigalg, x);
      if(sigalg) {
        const ASN1_OBJECT *sigalgoid = NULL;
        X509_ALGOR_get0(&sigalgoid, NULL, NULL, sigalg);
        i2a_ASN1_OBJECT(mem, sigalgoid);
        push_certinfo("Signature Algorithm", i);
      }

      xpubkey = X509_get_X509_PUBKEY(x);
      if(xpubkey) {
        X509_PUBKEY_get0_param(&pubkeyoid, NULL, NULL, NULL, xpubkey);
        if(pubkeyoid) {
          i2a_ASN1_OBJECT(mem, pubkeyoid);
          push_certinfo("Public Key Algorithm", i);
        }
      }

      X509V3_ext(data, i, X509_get0_extensions(x));
    }
#else
    {
      /* before OpenSSL 1.0.2 */
      X509_CINF *cinf = x->cert_info;

      i2a_ASN1_OBJECT(mem, cinf->signature->algorithm);
      push_certinfo("Signature Algorithm", i);

      i2a_ASN1_OBJECT(mem, cinf->key->algor->algorithm);
      push_certinfo("Public Key Algorithm", i);

      X509V3_ext(data, i, cinf->extensions);

      psig = x->signature;
    }
#endif

    ASN1_TIME_print(mem, X509_get0_notBefore(x));
    push_certinfo("Start date", i);

    ASN1_TIME_print(mem, X509_get0_notAfter(x));
    push_certinfo("Expire date", i);

    pubkey = X509_get_pubkey(x);
    if(!pubkey)
      infof(data, "   Unable to load public key");
    else {
      int pktype;
#ifdef HAVE_OPAQUE_EVP_PKEY
      pktype = EVP_PKEY_id(pubkey);
#else
      pktype = pubkey->type;
#endif
      switch(pktype) {
      case EVP_PKEY_RSA:
      {
#ifndef HAVE_EVP_PKEY_GET_PARAMS
        RSA *rsa;
#ifdef HAVE_OPAQUE_EVP_PKEY
        rsa = EVP_PKEY_get0_RSA(pubkey);
#else
        rsa = pubkey->pkey.rsa;
#endif /* HAVE_OPAQUE_EVP_PKEY */
#endif /* !HAVE_EVP_PKEY_GET_PARAMS */

        {
#ifdef HAVE_OPAQUE_RSA_DSA_DH
          DECLARE_PKEY_PARAM_BIGNUM(n);
          DECLARE_PKEY_PARAM_BIGNUM(e);
#ifdef HAVE_EVP_PKEY_GET_PARAMS
          EVP_PKEY_get_bn_param(pubkey, OSSL_PKEY_PARAM_RSA_N, &n);
          EVP_PKEY_get_bn_param(pubkey, OSSL_PKEY_PARAM_RSA_E, &e);
#else
          RSA_get0_key(rsa, &n, &e, NULL);
#endif /* HAVE_EVP_PKEY_GET_PARAMS */
          BIO_printf(mem, "%d", n ? BN_num_bits(n) : 0);
#else
          BIO_printf(mem, "%d", rsa->n ? BN_num_bits(rsa->n) : 0);
#endif /* HAVE_OPAQUE_RSA_DSA_DH */
          push_certinfo("RSA Public Key", i);
          print_pubkey_BN(rsa, n, i);
          print_pubkey_BN(rsa, e, i);
          FREE_PKEY_PARAM_BIGNUM(n);
          FREE_PKEY_PARAM_BIGNUM(e);
        }

        break;
      }
      case EVP_PKEY_DSA:
      {
#ifndef OPENSSL_NO_DSA
#ifndef HAVE_EVP_PKEY_GET_PARAMS
        DSA *dsa;
#ifdef HAVE_OPAQUE_EVP_PKEY
        dsa = EVP_PKEY_get0_DSA(pubkey);
#else
        dsa = pubkey->pkey.dsa;
#endif /* HAVE_OPAQUE_EVP_PKEY */
#endif /* !HAVE_EVP_PKEY_GET_PARAMS */
        {
#ifdef HAVE_OPAQUE_RSA_DSA_DH
          DECLARE_PKEY_PARAM_BIGNUM(p);
          DECLARE_PKEY_PARAM_BIGNUM(q);
          DECLARE_PKEY_PARAM_BIGNUM(g);
          DECLARE_PKEY_PARAM_BIGNUM(pub_key);
#ifdef HAVE_EVP_PKEY_GET_PARAMS
          EVP_PKEY_get_bn_param(pubkey, OSSL_PKEY_PARAM_FFC_P, &p);
          EVP_PKEY_get_bn_param(pubkey, OSSL_PKEY_PARAM_FFC_Q, &q);
          EVP_PKEY_get_bn_param(pubkey, OSSL_PKEY_PARAM_FFC_G, &g);
          EVP_PKEY_get_bn_param(pubkey, OSSL_PKEY_PARAM_PUB_KEY, &pub_key);
#else
          DSA_get0_pqg(dsa, &p, &q, &g);
          DSA_get0_key(dsa, &pub_key, NULL);
#endif /* HAVE_EVP_PKEY_GET_PARAMS */
#endif /* HAVE_OPAQUE_RSA_DSA_DH */
          print_pubkey_BN(dsa, p, i);
          print_pubkey_BN(dsa, q, i);
          print_pubkey_BN(dsa, g, i);
          print_pubkey_BN(dsa, pub_key, i);
          FREE_PKEY_PARAM_BIGNUM(p);
          FREE_PKEY_PARAM_BIGNUM(q);
          FREE_PKEY_PARAM_BIGNUM(g);
          FREE_PKEY_PARAM_BIGNUM(pub_key);
        }
#endif /* !OPENSSL_NO_DSA */
        break;
      }
      case EVP_PKEY_DH:
      {
#ifndef HAVE_EVP_PKEY_GET_PARAMS
        DH *dh;
#ifdef HAVE_OPAQUE_EVP_PKEY
        dh = EVP_PKEY_get0_DH(pubkey);
#else
        dh = pubkey->pkey.dh;
#endif /* HAVE_OPAQUE_EVP_PKEY */
#endif /* !HAVE_EVP_PKEY_GET_PARAMS */
        {
#ifdef HAVE_OPAQUE_RSA_DSA_DH
          DECLARE_PKEY_PARAM_BIGNUM(p);
          DECLARE_PKEY_PARAM_BIGNUM(q);
          DECLARE_PKEY_PARAM_BIGNUM(g);
          DECLARE_PKEY_PARAM_BIGNUM(pub_key);
#ifdef HAVE_EVP_PKEY_GET_PARAMS
          EVP_PKEY_get_bn_param(pubkey, OSSL_PKEY_PARAM_FFC_P, &p);
          EVP_PKEY_get_bn_param(pubkey, OSSL_PKEY_PARAM_FFC_Q, &q);
          EVP_PKEY_get_bn_param(pubkey, OSSL_PKEY_PARAM_FFC_G, &g);
          EVP_PKEY_get_bn_param(pubkey, OSSL_PKEY_PARAM_PUB_KEY, &pub_key);
#else
          DH_get0_pqg(dh, &p, &q, &g);
          DH_get0_key(dh, &pub_key, NULL);
#endif /* HAVE_EVP_PKEY_GET_PARAMS */
          print_pubkey_BN(dh, p, i);
          print_pubkey_BN(dh, q, i);
          print_pubkey_BN(dh, g, i);
#else
          print_pubkey_BN(dh, p, i);
          print_pubkey_BN(dh, g, i);
#endif /* HAVE_OPAQUE_RSA_DSA_DH */
          print_pubkey_BN(dh, pub_key, i);
          FREE_PKEY_PARAM_BIGNUM(p);
          FREE_PKEY_PARAM_BIGNUM(q);
          FREE_PKEY_PARAM_BIGNUM(g);
          FREE_PKEY_PARAM_BIGNUM(pub_key);
        }
        break;
      }
      }
      EVP_PKEY_free(pubkey);
    }

    if(psig) {
      for(j = 0; j < psig->length; j++)
        BIO_printf(mem, "%02x:", psig->data[j]);
      push_certinfo("Signature", i);
    }

    PEM_write_bio_X509(mem, x);
    push_certinfo("Cert", i);
  }

  BIO_free(mem);

  return CURLE_OK;
}